

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flic.cc
# Opt level: O0

void __thiscall Flic::readLc(Flic *this,FlicHeader *header,FlicFrame *frame,istream *is)

{
  uint8_t *__dest;
  reference pvVar1;
  void *pvVar2;
  ulong uVar3;
  char *tmp_1;
  int j_2;
  int j_1;
  char *tmp;
  int local_50;
  char count;
  int offset;
  int iStack_44;
  uint8_t pixelSkip;
  int k;
  int x;
  int packets;
  int iStack_34;
  int16_t lineSkip;
  int y;
  int j;
  uint16_t lines;
  istream *piStack_28;
  int bytespp;
  istream *is_local;
  FlicFrame *frame_local;
  FlicHeader *header_local;
  Flic *this_local;
  
  j = header->depth / 8;
  __dest = frame->pixels;
  piStack_28 = is;
  is_local = (istream *)frame;
  frame_local = (FlicFrame *)header;
  header_local = (FlicHeader *)this;
  pvVar1 = std::vector<FlicFrame,_std::allocator<FlicFrame>_>::back(&this->frames_);
  memcpy(__dest,pvVar1->pixels,
         (long)(int)((uint)*(ushort *)&frame_local[1].pixels *
                     (uint)*(ushort *)((long)&frame_local[1].pixels + 2) * j));
  std::istream::read((char *)piStack_28,(long)&y + 2);
  iStack_34 = 0;
  packets = 0;
  while (iStack_34 < (int)(uint)y._2_2_) {
    std::istream::read((char *)piStack_28,(long)&x + 2);
    if (x._2_2_ < 0) {
      packets = packets - x._2_2_;
    }
    else {
      k = (int)x._2_2_;
      iStack_44 = 0;
      for (offset = 0; offset < k; offset = offset + 1) {
        std::istream::read((char *)piStack_28,(long)&count);
        iStack_44 = (uint)(byte)count + iStack_44;
        local_50 = ((((uint)*(ushort *)((long)&frame_local[1].pixels + 2) - packets) + -1) *
                    (uint)*(ushort *)&frame_local[1].pixels + iStack_44) * j;
        std::istream::read((char *)piStack_28,(long)&tmp + 7);
        if (tmp._7_1_ < '\0') {
          uVar3 = (ulong)j;
          if ((long)uVar3 < 0) {
            uVar3 = 0xffffffffffffffff;
          }
          pvVar2 = operator_new__(uVar3);
          std::istream::read((char *)piStack_28,(long)pvVar2);
          for (tmp_1._4_4_ = 0; SBORROW4(tmp_1._4_4_,-(int)tmp._7_1_) != tmp_1._4_4_ + tmp._7_1_ < 0
              ; tmp_1._4_4_ = tmp_1._4_4_ + 1) {
            memcpy((void *)(*(long *)is_local + (long)local_50 + (long)(tmp_1._4_4_ * j)),pvVar2,
                   (long)j);
          }
          iStack_44 = iStack_44 - tmp._7_1_;
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2);
          }
        }
        else {
          for (tmp_1._0_4_ = 0; (int)tmp_1 < tmp._7_1_; tmp_1._0_4_ = (int)tmp_1 + 1) {
            uVar3 = (ulong)j;
            if ((long)uVar3 < 0) {
              uVar3 = 0xffffffffffffffff;
            }
            pvVar2 = operator_new__(uVar3);
            std::istream::read((char *)piStack_28,(long)pvVar2);
            memcpy((void *)(*(long *)is_local + (long)local_50 + (long)((int)tmp_1 * j)),pvVar2,
                   (long)j);
            if (pvVar2 != (void *)0x0) {
              operator_delete(pvVar2);
            }
          }
          iStack_44 = tmp._7_1_ + iStack_44;
        }
      }
      packets = packets + 1;
      iStack_34 = iStack_34 + 1;
    }
  }
  return;
}

Assistant:

void Flic::readLc(const FlicHeader &header, FlicFrame &frame, std::istream &is) {
	int bytespp = header.depth / 8;
	memcpy(frame.pixels, frames_.back().pixels, header.width * header.height * bytespp);
	uint16_t lines;
	is.read((char*)&lines, 2);
	int j = 0, y = 0;
	while (j < lines) {
		int16_t lineSkip;
		is.read(reinterpret_cast<char*>(&lineSkip), 2);
		if (lineSkip < 0) {
			y += -lineSkip;
			continue;
		} else {
			int packets = lineSkip;
			int x = 0;
			for (int k = 0; k < packets; ++k) {
				uint8_t pixelSkip;
				is.read((char*)&pixelSkip, 1);
				x += pixelSkip;
				int offset = ((header.height - y - 1) * header.width + x) * bytespp;
				char count;
				is.read(&count, 1);
				if (count < 0) {
					char *tmp = new char[bytespp];
					is.read(tmp, bytespp);
					for (int j = 0; j < -count; ++j) {
						memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
					}
					x += -count;
					delete tmp;
				} else {
					for (int j = 0; j < count; ++j) {
						char *tmp = new char[bytespp];
						is.read(tmp, bytespp);
						memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
						delete tmp;
					}
					x += count;
				}
			}
			++y;
		}
		++j;
	}
}